

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

unsigned_long getDebugLevel(char *variableName,unsigned_long defaultDebugLevel)

{
  char *__nptr;
  int *piVar1;
  ulong uVar2;
  char *afterValue;
  char *local_18;
  
  __nptr = getenv(variableName);
  if (__nptr != (char *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0;
    local_18 = (char *)0x0;
    uVar2 = strtoul(__nptr,&local_18,10);
    if (((*piVar1 == 0) && (local_18 != __nptr)) && (*local_18 == '\0')) {
      return uVar2;
    }
    *piVar1 = 0;
  }
  return 0;
}

Assistant:

static unsigned long
getDebugLevel(const char *variableName, unsigned long defaultDebugLevel) {
  const char *const valueOrNull = getenv(variableName);
  if (valueOrNull == NULL) {
    return defaultDebugLevel;
  }
  const char *const value = valueOrNull;

  errno = 0;
  char *afterValue = NULL;
  unsigned long debugLevel = strtoul(value, &afterValue, 10);
  if ((errno != 0) || (afterValue == value) || (afterValue[0] != '\0')) {
    errno = 0;
    return defaultDebugLevel;
  }

  return debugLevel;
}